

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O1

FeatureOptions<wasm::HeapType> * __thiscall
wasm::Random::FeatureOptions<wasm::HeapType>::add<>
          (FeatureOptions<wasm::HeapType> *this,FeatureSet feature,HeapType option)

{
  iterator __position;
  vector<wasm::HeapType,std::allocator<wasm::HeapType>> *this_00;
  key_type local_1c;
  HeapType HStack_18;
  FeatureSet feature_local;
  HeapType option_local;
  
  local_1c.features = feature.features;
  HStack_18.id = option.id;
  this_00 = (vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)
            std::
            map<wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
            ::operator[](&this->options,&local_1c);
  __position._M_current = *(HeapType **)(this_00 + 8);
  if (__position._M_current == *(HeapType **)(this_00 + 0x10)) {
    std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
    _M_realloc_insert<wasm::HeapType_const&>(this_00,__position,&stack0xffffffffffffffe8);
  }
  else {
    (__position._M_current)->id = HStack_18.id;
    *(HeapType **)(this_00 + 8) = __position._M_current + 1;
  }
  return this;
}

Assistant:

FeatureOptions<T>& add(FeatureSet feature, T option, Ts... rest) {
      options[feature].push_back(option);
      return add(feature, rest...);
    }